

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.h
# Opt level: O2

socklen_t __thiscall hwnet::Addr::AddrLen(Addr *this)

{
  socklen_t sVar1;
  uint uVar2;
  
  uVar2 = this->addrType - 1;
  sVar1 = 0;
  if (uVar2 < 3) {
    sVar1 = *(socklen_t *)(&DAT_00127c24 + (ulong)uVar2 * 4);
  }
  return sVar1;
}

Assistant:

socklen_t AddrLen() const {
		if(this->addrType == SOCK_ADDR_IPV4) {
    		return sizeof(this->sockaddr.in);
    	} else if(this->addrType == SOCK_ADDR_IPV6) {
    		return sizeof(this->sockaddr.in6);
    	} else if(this->addrType == SOCK_ADDR_UNIX) {
    		return sizeof(this->sockaddr.un);
    	} else {
    		return 0;
    	}
    }